

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_>
wallet::HandleLoadWallet(WalletContext *context,LoadWalletFn *load_wallet)

{
  list<std::function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>,_std::allocator<std::function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>_>_>
  *in_RDX;
  long in_RSI;
  _Head_base<0UL,_interfaces::Handler_*,_false> in_RDI;
  function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>
  *__args;
  long in_FS_OFFSET;
  iterator it;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock9;
  function<void_()> *in_stack_ffffffffffffff38;
  anon_class_16_2_05eeb213 *in_stack_ffffffffffffff40;
  function<void_()> *this;
  char *in_stack_ffffffffffffff60;
  const_iterator in_stack_ffffffffffffff70;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffff78;
  function<void_()> local_50;
  _List_node_base *local_30;
  _List_node_base *local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffff38);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffff78,
             (AnnotatedMixin<std::mutex> *)in_stack_ffffffffffffff70._M_node,(char *)in_RDX,
             in_stack_ffffffffffffff60,(int)((ulong)in_RDI._M_head_impl >> 0x20),
             SUB81((ulong)in_RDI._M_head_impl >> 0x18,0));
  __args = (function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>
            *)(in_RSI + 0x58);
  local_30 = (_List_node_base *)
             std::__cxx11::
             list<std::function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>,_std::allocator<std::function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>_>_>
             ::end((list<std::function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>,_std::allocator<std::function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>_>_>
                    *)in_stack_ffffffffffffff40);
  std::
  _List_const_iterator<std::function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>_>
  ::_List_const_iterator
            ((_List_const_iterator<std::function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>_>
              *)in_stack_ffffffffffffff38,(iterator *)0xac96e2);
  local_20 = (_List_node_base *)
             std::__cxx11::
             list<std::function<void(std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>)>,std::allocator<std::function<void(std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>)>>>
             ::
             emplace<std::function<void(std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>)>>
                       (in_RDX,in_stack_ffffffffffffff70,__args);
  this = &local_50;
  std::function<void()>::
  function<wallet::HandleLoadWallet(wallet::WalletContext&,std::function<void(std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>)>)::__0,void>
            (this,in_stack_ffffffffffffff40);
  interfaces::MakeCleanupHandler(this);
  std::function<void_()>::~function(in_stack_ffffffffffffff38);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(tuple<interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>)
             in_RDI._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<interfaces::Handler> HandleLoadWallet(WalletContext& context, LoadWalletFn load_wallet)
{
    LOCK(context.wallets_mutex);
    auto it = context.wallet_load_fns.emplace(context.wallet_load_fns.end(), std::move(load_wallet));
    return interfaces::MakeCleanupHandler([&context, it] { LOCK(context.wallets_mutex); context.wallet_load_fns.erase(it); });
}